

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvp.h
# Opt level: O3

void __thiscall
hiberlite::
collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::collection_nvp(collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *this,string *_name,
                stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *_s)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + _name->_M_string_length);
  uVar2 = *(undefined4 *)((long)&_s->ct + 4);
  uVar3 = *(undefined4 *)&(_s->it)._M_current;
  uVar4 = *(undefined4 *)((long)&(_s->it)._M_current + 4);
  *(undefined4 *)&(this->stream).ct = *(undefined4 *)&_s->ct;
  *(undefined4 *)((long)&(this->stream).ct + 4) = uVar2;
  *(undefined4 *)&(this->stream).it._M_current = uVar3;
  *(undefined4 *)((long)&(this->stream).it._M_current + 4) = uVar4;
  (this->stream).xx._M_dataplus._M_p = (pointer)&(this->stream).xx.field_2;
  pcVar1 = (_s->xx)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->stream).xx,pcVar1,pcVar1 + (_s->xx)._M_string_length);
  return;
}

Assistant:

collection_nvp(std::string _name, Stream _s) : name(_name), stream(_s) {}